

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_walls_draw.cpp
# Opt level: O0

void __thiscall GLWall::MakeVertices(GLWall *this,bool nosplit)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  byte local_29;
  FFlatVertex *local_20;
  FFlatVertex *ptr;
  bool split;
  GLWall *pGStack_10;
  bool nosplit_local;
  GLWall *this_local;
  
  if (this->vertcount == 0) {
    ptr._7_1_ = nosplit;
    pGStack_10 = this;
    bVar2 = FBoolCVar::operator_cast_to_bool(&gl_seamless);
    local_29 = 0;
    if ((((bVar2) && (local_29 = 0, (ptr._7_1_ & 1) == 0)) &&
        (local_29 = 0, this->seg->sidedef != (side_t *)0x0)) &&
       (local_29 = 0, (this->seg->sidedef->Flags & 0x40) == 0)) {
      local_29 = (this->flags & 0x40) != 0 ^ 0xff;
    }
    ptr._6_1_ = local_29 & 1;
    local_20 = FFlatVertexBuffer::GetBuffer(GLRenderer->mVBO);
    FFlatVertex::Set(local_20,(this->glseg).x1,this->zbottom[0],(this->glseg).y1,this->tcs[0].u,
                     this->tcs[0].v);
    local_20 = local_20 + 1;
    if ((((ptr._6_1_ & 1) != 0) && (fVar1 = (this->glseg).fracleft, fVar1 == 0.0)) && (!NAN(fVar1)))
    {
      SplitLeftEdge(this,&local_20);
    }
    FFlatVertex::Set(local_20,(this->glseg).x1,this->ztop[0],(this->glseg).y1,this->tcs[1].u,
                     this->tcs[1].v);
    local_20 = local_20 + 1;
    if (((ptr._6_1_ & 1) != 0) && ((this->flags & 0x10) == 0)) {
      SplitUpperEdge(this,&local_20);
    }
    FFlatVertex::Set(local_20,(this->glseg).x2,this->ztop[1],(this->glseg).y2,this->tcs[2].u,
                     this->tcs[2].v);
    local_20 = local_20 + 1;
    if ((((ptr._6_1_ & 1) != 0) && (fVar1 = (this->glseg).fracright, fVar1 == 1.0)) && (!NAN(fVar1))
       ) {
      SplitRightEdge(this,&local_20);
    }
    FFlatVertex::Set(local_20,(this->glseg).x2,this->zbottom[1],(this->glseg).y2,this->tcs[3].u,
                     this->tcs[3].v);
    local_20 = local_20 + 1;
    if (((ptr._6_1_ & 1) != 0) && ((this->flags & 0x20) == 0)) {
      SplitLowerEdge(this,&local_20);
    }
    uVar3 = FFlatVertexBuffer::GetCount(GLRenderer->mVBO,local_20,&this->vertindex);
    this->vertcount = uVar3;
  }
  return;
}

Assistant:

void GLWall::MakeVertices(bool nosplit)
{
	if (vertcount == 0)
	{
		bool split = (gl_seamless && !nosplit && seg->sidedef != NULL && !(seg->sidedef->Flags & WALLF_POLYOBJ) && !(flags & GLWF_NOSPLIT));

		FFlatVertex *ptr = GLRenderer->mVBO->GetBuffer();

		ptr->Set(glseg.x1, zbottom[0], glseg.y1, tcs[LOLFT].u, tcs[LOLFT].v);
		ptr++;
		if (split && glseg.fracleft == 0) SplitLeftEdge(ptr);
		ptr->Set(glseg.x1, ztop[0], glseg.y1, tcs[UPLFT].u, tcs[UPLFT].v);
		ptr++;
		if (split && !(flags & GLWF_NOSPLITUPPER)) SplitUpperEdge(ptr);
		ptr->Set(glseg.x2, ztop[1], glseg.y2, tcs[UPRGT].u, tcs[UPRGT].v);
		ptr++;
		if (split && glseg.fracright == 1) SplitRightEdge(ptr);
		ptr->Set(glseg.x2, zbottom[1], glseg.y2, tcs[LORGT].u, tcs[LORGT].v);
		ptr++;
		if (split && !(flags & GLWF_NOSPLITLOWER)) SplitLowerEdge(ptr);
		vertcount = GLRenderer->mVBO->GetCount(ptr, &vertindex);
	}
}